

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandWeaponAmmo::Tick
          (CommandWeaponAmmo *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  PClassAmmo *pPVar1;
  PClassAmmo *pPVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool match2;
  bool match1;
  bool usesammo2;
  bool usesammo1;
  PClass *AmmoType2;
  PClass *AmmoType1;
  bool hudChanged_local;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  CommandWeaponAmmo *this_local;
  
  SBarInfoCommandFlowControl::Tick((SBarInfoCommandFlowControl *)this,block,statusBar,hudChanged);
  if (((statusBar->super_DBaseStatusBar).CPlayer)->ReadyWeapon != (AWeapon *)0x0) {
    pPVar1 = ((statusBar->super_DBaseStatusBar).CPlayer)->ReadyWeapon->AmmoType1;
    pPVar2 = ((statusBar->super_DBaseStatusBar).CPlayer)->ReadyWeapon->AmmoType2;
    bVar4 = pPVar1 != (PClassAmmo *)0x0;
    bVar5 = pPVar2 != (PClassAmmo *)0x0;
    if (this->ammo[1] == (PClass *)0x0) {
      if (((bVar4) && (pPVar1 == (PClassAmmo *)this->ammo[0])) ||
         ((bVar5 && (pPVar2 == (PClassAmmo *)this->ammo[0])))) {
        SBarInfoCommandFlowControl::SetTruth
                  ((SBarInfoCommandFlowControl *)this,true,block,statusBar);
        return;
      }
    }
    else {
      if ((!bVar4) ||
         ((bVar3 = true, pPVar1 != (PClassAmmo *)this->ammo[0] &&
          (bVar3 = true, pPVar1 != (PClassAmmo *)this->ammo[1])))) {
        bVar3 = !bVar4;
      }
      if ((!bVar5) ||
         ((bVar4 = true, pPVar2 != (PClassAmmo *)this->ammo[0] &&
          (bVar4 = true, pPVar2 != (PClassAmmo *)this->ammo[1])))) {
        bVar4 = !bVar5;
      }
      if ((((this->conditionAnd & 1U) == 0) && ((bVar3 || (bVar4)))) ||
         (((this->conditionAnd & 1U) != 0 && ((bVar3 && (bVar4)))))) {
        SBarInfoCommandFlowControl::SetTruth
                  ((SBarInfoCommandFlowControl *)this,true,block,statusBar);
        return;
      }
    }
  }
  SBarInfoCommandFlowControl::SetTruth((SBarInfoCommandFlowControl *)this,false,block,statusBar);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoNegatableFlowControl::Tick(block, statusBar, hudChanged);

			if(statusBar->CPlayer->ReadyWeapon != NULL)
			{
				const PClass *AmmoType1 = statusBar->CPlayer->ReadyWeapon->AmmoType1;
				const PClass *AmmoType2 = statusBar->CPlayer->ReadyWeapon->AmmoType2;
				bool usesammo1 = (AmmoType1 != NULL);
				bool usesammo2 = (AmmoType2 != NULL);
				//if(!usesammo1 && !usesammo2) //if the weapon doesn't use ammo don't go though the trouble.
				//{
				//	SetTruth(false, block, statusBar);
				//	return;
				//}
				//Or means only 1 ammo type needs to match and means both need to match.
				if(ammo[1] != NULL)
				{
					bool match1 = ((usesammo1 && (AmmoType1 == ammo[0] || AmmoType1 == ammo[1])) || !usesammo1);
					bool match2 = ((usesammo2 && (AmmoType2 == ammo[0] || AmmoType2 == ammo[1])) || !usesammo2);
					if((!conditionAnd && (match1 || match2)) || (conditionAnd && (match1 && match2)))
					{
						SetTruth(true, block, statusBar);
						return;
					}
				}
				else
				{
					if((usesammo1 && (AmmoType1 == ammo[0])) || (usesammo2 && (AmmoType2 == ammo[0])))
					{
						SetTruth(true, block, statusBar);
						return;
					}
				}
			}
			SetTruth(false, block, statusBar);
		}